

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestEventStream.cpp
# Opt level: O0

bool binlog::operator==(EventSource *a,EventSource *b)

{
  __type _Var1;
  long *in_RSI;
  long *in_RDI;
  __type local_11;
  
  local_11 = false;
  if ((*in_RDI == *in_RSI) && (local_11 = false, (short)in_RDI[1] == (short)in_RSI[1])) {
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)a,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)b);
    local_11 = false;
    if (_Var1) {
      _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)a
                              ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               b);
      local_11 = false;
      if (_Var1) {
        _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )a,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)b);
        local_11 = false;
        if ((_Var1) && (local_11 = false, in_RDI[0xe] == in_RSI[0xe])) {
          _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)a,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)b);
          local_11 = false;
          if (_Var1) {
            local_11 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)a,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)b);
          }
        }
      }
    }
  }
  return local_11;
}

Assistant:

bool operator==(const EventSource& a, const EventSource& b)
{
  return a.id == b.id
    &&   a.severity == b.severity
    &&   a.category == b.category
    &&   a.function == b.function
    &&   a.file == b.file
    &&   a.line == b.line
    &&   a.formatString == b.formatString
    &&   a.argumentTags == b.argumentTags;
}